

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLengthen.cpp
# Opt level: O3

int CmdLengthen(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  Interval *interval;
  bool verbose;
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  time_t delta;
  ostream *poVar3;
  string *psVar4;
  string *psVar5;
  pointer pIVar6;
  iterator __end3;
  vector<Interval,_std::allocator<Interval>_> intervals;
  IntervalFilterAllWithIds filtering;
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  Duration dur;
  char local_151;
  string local_150;
  Journal *local_130;
  CLI *local_128;
  vector<Interval,_std::allocator<Interval>_> local_120;
  undefined1 local_108 [16];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_f8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_b8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_88;
  Duration local_58;
  
  local_130 = journal;
  local_108._0_8_ = &local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"verbose","");
  verbose = Rules::getBoolean(rules,(string *)local_108,false);
  if ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
      local_108._0_8_ != &local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8._M_impl._0_8_ + 1);
  }
  CLI::getIds((set<int,_std::less<int>,_std::allocator<int>_> *)&local_b8,cli);
  if (local_b8._M_impl.super__Rb_tree_header._M_node_count == 0) {
    psVar5 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar5 = psVar5 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar5,"IDs must be specified. See \'timew help lengthen\'.","");
    __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  CLI::getDuration(&local_58,cli);
  Journal::startTransaction(local_130);
  flattenDatabase(database,rules);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_88,&local_b8);
  IntervalFilterAllWithIds::IntervalFilterAllWithIds
            ((IntervalFilterAllWithIds *)local_108,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&local_88);
  local_128 = cli;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_88);
  getTracked(&local_120,database,rules,(IntervalFilter *)local_108);
  interval = local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (((long)local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_start >> 6) * -0x5555555555555555 -
      local_b8._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var2 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &local_b8._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if (local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00141f91:
        psVar4 = (string *)__cxa_allocate_exception(0x20);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,"ID \'@{1}\' does not correspond to any tracking.","");
        format<int>(psVar4,1,&local_150,p_Var2[1]._M_color);
        __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      pIVar6 = local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
               super__Vector_impl_data._M_start;
      while (pIVar6->id != p_Var2[1]._M_color) {
        pIVar6 = pIVar6 + 1;
        if (pIVar6 == local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                      super__Vector_impl_data._M_finish) goto LAB_00141f91;
      }
    }
  }
  while( true ) {
    if (interval ==
        local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Journal::endTransaction(local_130);
      std::vector<Interval,_std::allocator<Interval>_>::~vector(&local_120);
      local_108._0_8_ = &PTR_accepts_0019f980;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_f8);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_b8);
      return 0;
    }
    bVar1 = Range::is_open(&interval->super_Range);
    if (bVar1) break;
    Database::deleteInterval(database,interval);
    delta = Duration::toTime_t(&local_58);
    Datetime::operator+=(&(interval->super_Range).end,delta);
    validate(local_128,rules,database,interval);
    Database::addInterval(database,interval,verbose);
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Lengthened @",0xc);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,interval->id);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," by ",4);
      Duration::formatHours_abi_cxx11_(&local_150,&local_58);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_150._M_dataplus._M_p,local_150._M_string_length);
      local_151 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_151,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
    }
    interval = interval + 1;
  }
  psVar4 = (string *)__cxa_allocate_exception(0x20);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"Cannot lengthen open interval @{1}","");
  format<int>(psVar4,1,&local_150,interval->id);
  __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

int CmdLengthen (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  auto ids = cli.getIds ();

  if (ids.empty ())
  {
    throw std::string ("IDs must be specified. See 'timew help lengthen'.");
  }

  auto dur = cli.getDuration ();

  journal.startTransaction ();

  flattenDatabase (database, rules);
  auto filtering = IntervalFilterAllWithIds (ids);
  auto intervals = getTracked (database, rules, filtering);

  if (intervals.size () != ids.size ())
  {
    for (auto& id: ids)
    {
      bool found = false;

      for (auto& interval: intervals)
      {
        if (interval.id == id)
        {
          found = true;
          break;
        }
      }
      if (! found)
      {
        throw format ("ID '@{1}' does not correspond to any tracking.", id);
      }
    }
  }

  // Lengthen intervals specified by ids
  for (auto& interval : intervals)
  {
    if (interval.is_open ())
    {
      throw format ("Cannot lengthen open interval @{1}", interval.id);
    }

    database.deleteInterval (interval);

    interval.end += dur.toTime_t ();
    validate (cli, rules, database, interval);
    database.addInterval (interval, verbose);

    if (verbose)
    {
      std::cout << "Lengthened @" << interval.id << " by " << dur.formatHours () << '\n';
    }
  }

  journal.endTransaction ();

  return 0;
}